

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O2

double __thiscall libcalc::Tokenizer::evaluate(Tokenizer *this)

{
  byte bVar1;
  double *pdVar2;
  int iVar3;
  _Map_pointer ppdVar4;
  _Map_pointer ppdVar5;
  undefined1 local_b8 [8];
  stack<double,_std::deque<double,_std::allocator<double>_>_> temp;
  _Map_pointer local_60;
  double local_50;
  double *local_48;
  double *local_40;
  double local_38;
  double a;
  
  std::stack<double,std::deque<double,std::allocator<double>>>::
  stack<std::deque<double,std::allocator<double>>,void>
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)local_b8);
  toRPN((vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *)
        &temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_node,this);
  for (ppdVar5 = temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node; ppdVar5 != local_60;
      ppdVar5 = ppdVar5 + 1) {
    pdVar2 = *ppdVar5;
    if (*(char *)(pdVar2 + 4) == '\x01') {
      ppdVar4 = temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node ==
          (_Map_pointer)
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur) {
        ppdVar4 = (_Map_pointer)
                  ((long)temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_last[-1] + 0x200);
      }
      local_48 = ppdVar4[-1];
      std::deque<double,_std::allocator<double>_>::pop_back
                ((deque<double,_std::allocator<double>_> *)local_b8);
      ppdVar4 = temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node ==
          (_Map_pointer)
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur) {
        ppdVar4 = (_Map_pointer)
                  ((long)temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_last[-1] + 0x200);
      }
      bVar1 = *(byte *)*pdVar2;
      local_40 = ppdVar4[-1];
      std::deque<double,_std::allocator<double>_>::pop_back
                ((deque<double,_std::allocator<double>_> *)local_b8);
      if (bVar1 - 0x21 < 0xf) {
        switch((uint)bVar1) {
        case 0x21:
          iVar3 = factorial((int)(double)local_48);
          local_38 = (double)iVar3;
          break;
        case 0x25:
          local_38 = (double)((int)(double)local_40 % (int)(double)local_48);
          break;
        case 0x2a:
          local_38 = (double)local_48 * (double)local_40;
          break;
        case 0x2b:
          local_38 = (double)local_48 + (double)local_40;
          break;
        case 0x2d:
          local_38 = (double)local_40 - (double)local_48;
          break;
        case 0x2f:
          local_38 = (double)local_40 / (double)local_48;
        }
      }
      else if (bVar1 == 0x5e) {
        local_38 = (double)((int)(double)local_48 ^ (int)(double)local_40);
      }
      std::deque<double,_std::allocator<double>_>::push_back
                ((deque<double,_std::allocator<double>_> *)local_b8,&local_38);
    }
    else {
      local_50 = atof((char *)*pdVar2);
      std::deque<double,_std::allocator<double>_>::emplace_back<double>
                ((deque<double,_std::allocator<double>_> *)local_b8,&local_50);
    }
  }
  std::_Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::~_Vector_base
            ((_Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *)
             &temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_start._M_node ==
      (_Map_pointer)
      temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur) {
    temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
    _M_start._M_node =
         (_Map_pointer)
         ((long)temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last[-1] + 0x200);
  }
  local_48 = temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_start._M_node[-1];
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
            ((_Deque_base<double,_std::allocator<double>_> *)local_b8);
  return (double)local_48;
}

Assistant:

double Tokenizer::evaluate() {
  std::stack<double> temp;
  double l, a, r;
  char o;

  for (Token *t : toRPN()) {
    if (t->type == TOKEN_TYPE.OPERATOR) {

      r = temp.top();
      temp.pop();

      o = t->value.c_str()[0];

      l = temp.top();
      temp.pop();

      switch(o) {
        case '+': a =  l + r ; break;
        case '-': a =  l - r ; break;
        case '*': a =  l * r ; break;
        case '/': a =  l / r ; break;
        case '%': a =  (int)l % (int) r ; break;
        case '^': a =  (int)l ^ (int)r ; break;
        case '!': a =  factorial(r) ; break;
      }

      temp.push(a);

    } else {
      temp.push(std::atof(t->value.c_str()));
    }
  }

  return temp.top();
}